

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hlp_context.cpp
# Opt level: O2

bool __thiscall r_exec::HLPContext::evaluate_no_dereference(HLPContext *this,uint16_t *result_index)

{
  Atom *pAVar1;
  BindingMap *this_00;
  undefined2 uVar2;
  Data DVar3;
  uint16_t *puVar4;
  bool bVar5;
  uint8_t id;
  uint16_t uVar6;
  int iVar7;
  Atom *intermediate_results;
  uint uVar8;
  uint16_t i;
  ushort uVar9;
  byte bVar10;
  uint16_t unused_result_index;
  uint16_t *local_78;
  Context _c;
  Operator op;
  
  uVar8 = (this->super__Context).data - VALUE_ARRAY;
  if (uVar8 < 3) {
    bVar10 = 3 >> ((byte)uVar8 & 7);
    goto LAB_00187b83;
  }
  bVar10 = r_code::Atom::getDescriptor();
  uVar8 = bVar10 - 0xc1;
  if (uVar8 < 0xe) {
    local_78 = result_index;
    if ((0x3f8fU >> (uVar8 & 0x1f) & 1) != 0) {
      iVar7 = (*(this->super__Context)._vptr__Context[6])(this);
      uVar9 = 1;
      do {
        if ((ushort)iVar7 < uVar9) {
          *local_78 = (this->super__Context).index;
          goto LAB_00187b80;
        }
        getChild((HLPContext *)&_c,this,uVar9);
        operator*((HLPContext *)&op,(HLPContext *)&_c);
        bVar5 = evaluate_no_dereference((HLPContext *)&op,&unused_result_index);
        uVar9 = uVar9 + 1;
      } while (bVar5);
      bVar10 = 0;
      goto LAB_00187b83;
    }
    if (uVar8 == 4) {
      iVar7 = (*(this->super__Context)._vptr__Context[6])(this);
      uVar9 = 1;
      bVar10 = 0;
      do {
        if ((ushort)iVar7 < uVar9) {
          uVar6 = r_code::Atom::asOpcode();
          Operator::Get(&op,uVar6);
          _c.implementation = (_Context *)operator_new(0x20);
          puVar4 = local_78;
          uVar2 = *(undefined2 *)&(this->super__Context).field_0x1a;
          DVar3 = (this->super__Context).data;
          (_c.implementation)->index = (this->super__Context).index;
          *(undefined2 *)&(_c.implementation)->field_0x1a = uVar2;
          (_c.implementation)->data = DVar3;
          pAVar1 = (this->super__Context).code;
          (_c.implementation)->overlay = (this->super__Context).overlay;
          (_c.implementation)->code = pAVar1;
          (_c.implementation)->_vptr__Context = (_func_int **)&PTR___Context_001d1ff8;
          _c._vptr_Context = (_func_int **)&PTR__Context_001d0508;
          bVar5 = (*op._operator)(&_c,local_78);
          bVar10 = true;
          if (!bVar5) {
            if (op._overload == (_func_bool_Context_ptr_uint16_t_ptr *)0x0) {
              bVar10 = false;
            }
            else {
              bVar10 = (*op._overload)(&_c,puVar4);
            }
          }
          _c._vptr_Context = (_func_int **)&PTR__Context_001d0508;
          if (_c.implementation != (_Context *)0x0) {
            (*(_c.implementation)->_vptr__Context[1])();
          }
          break;
        }
        getChild((HLPContext *)&_c,this,uVar9);
        operator*((HLPContext *)&op,(HLPContext *)&_c);
        bVar5 = evaluate_no_dereference((HLPContext *)&op,&unused_result_index);
        uVar9 = uVar9 + 1;
      } while (bVar5);
      goto LAB_00187b83;
    }
  }
  if (bVar10 == 0x8d) {
    pAVar1 = (this->super__Context).code;
    uVar6 = r_code::Atom::asIndex();
    HLPContext((HLPContext *)&op,pAVar1,uVar6,(HLPOverlay *)(this->super__Context).overlay,STEM);
    bVar10 = evaluate_no_dereference((HLPContext *)&op,result_index);
    if ((bool)bVar10) {
      pAVar1 = (this->super__Context).code;
      this_00 = (BindingMap *)(this->super__Context).overlay[1].super__Object._vptr__Object;
      id = r_code::Atom::asAssignmentIndex();
      uVar6 = r_code::Atom::asIndex();
      intermediate_results =
           r_code::vector<r_code::Atom>::operator[](&((this->super__Context).overlay)->values,0);
      BindingMap::bind_variable(this_00,pAVar1,id,uVar6,intermediate_results);
    }
  }
  else {
    *result_index = (this->super__Context).index;
LAB_00187b80:
    bVar10 = 1;
  }
LAB_00187b83:
  return (bool)(bVar10 & 1);
}

Assistant:

bool HLPContext::evaluate_no_dereference(uint16_t &result_index) const
{
    switch (data) {
    case VALUE_ARRAY:
    case BINDING_MAP:
        return true;

    case UNDEFINED:
        return false;

    default:
        break;
    }

    switch (code[index].getDescriptor()) {
    case Atom::ASSIGN_PTR: {
        HLPContext c(code, code[index].asIndex(), (HLPOverlay *)overlay);

        if (c.evaluate_no_dereference(result_index)) {
            ((HLPOverlay *)overlay)->bindings->bind_variable(code, code[index].asAssignmentIndex(), code[index].asIndex(), &overlay->values[0]);
            return true;
        } else {
            return false;
        }
    }

    case Atom::OPERATOR: {
        uint16_t atom_count = getChildrenCount();

        for (uint16_t i = 1; i <= atom_count; ++i) {
            uint16_t unused_result_index;

            if (!(*getChild(i)).evaluate_no_dereference(unused_result_index)) {
                return false;
            }
        }

        Operator op = Operator::Get((*this)[0].asOpcode());
        HLPContext *c = new HLPContext(*this);
        Context _c(c);
        return op(_c, result_index);
    }

    case Atom::OBJECT:
    case Atom::MARKER:
    case Atom::INSTANTIATED_PROGRAM:
    case Atom::INSTANTIATED_CPP_PROGRAM:
    case Atom::INSTANTIATED_INPUT_LESS_PROGRAM:
    case Atom::INSTANTIATED_ANTI_PROGRAM:
    case Atom::COMPOSITE_STATE:
    case Atom::MODEL:
    case Atom::GROUP:
    case Atom::SET:
    case Atom::S_SET: {
        uint16_t atom_count = getChildrenCount();

        for (uint16_t i = 1; i <= atom_count; ++i) {
            uint16_t unused_result_index;

            if (!(*getChild(i)).evaluate_no_dereference(unused_result_index)) {
                return false;
            }
        }

        result_index = index;
        return true;
    }

    default:
        result_index = index;
        return true;
    }
}